

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O0

bool __thiscall
cmExportInstallFileGenerator::GenerateMainFile(cmExportInstallFileGenerator *this,ostream *os)

{
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  cmTargetExport *targetExport;
  cmGeneratorTarget *target;
  bool bVar1;
  TargetType TVar2;
  PolicyStatus PVar3;
  uint uVar4;
  cmExportSet *pcVar5;
  vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
  *this_02;
  pointer pcVar6;
  ostream *poVar7;
  reference ppcVar8;
  string *psVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  reference pbVar11;
  pair<std::_Rb_tree_const_iterator<cmGeneratorTarget_*>,_bool> pVar12;
  bool local_651;
  bool local_5e5;
  string *c_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  string *c;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string cxx_modules_name;
  undefined1 local_508 [6];
  bool result;
  allocator<char> local_4e1;
  string local_4e0;
  cmValue local_4c0;
  bool local_4b1;
  undefined1 local_4b0 [7];
  bool newCMP0022Behavior;
  string errorMessage;
  string local_488;
  allocator<char> local_461;
  string local_460;
  allocator<char> local_439;
  string local_438;
  allocator<char> local_411;
  string local_410;
  allocator<char> local_3e9;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  undefined1 local_350 [8];
  string includesDestinationDirs;
  ImportPropertyMap properties;
  TargetType targetType;
  cmGeneratorTarget *gt;
  cmTargetExport *te_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *__range1_1;
  undefined1 local_2c8 [3];
  bool requiresConfigFiles;
  undefined1 local_2a8 [8];
  ostringstream e;
  pointer local_130;
  _Base_ptr local_128;
  undefined1 local_120;
  _Base_ptr local_118;
  undefined1 local_110;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  reference local_a8;
  unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_> *te;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
  *__range1;
  string sep;
  string expectedTargets;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> allTargets;
  ostream *os_local;
  cmExportInstallFileGenerator *this_local;
  
  std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::vector
            ((vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *)
             ((long)&expectedTargets.field_2 + 8));
  std::__cxx11::string::string((string *)(sep.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&__range1);
  pcVar5 = cmInstallExportGenerator::GetExportSet(this->IEGen);
  this_02 = cmExportSet::GetTargetExports(pcVar5);
  __end1 = std::
           vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
           ::begin(this_02);
  te = (unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_> *)
       std::
       vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
       ::end(this_02);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_*,_std::vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>_>
                                     *)&te), bVar1) {
    local_a8 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_*,_std::vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>_>
               ::operator*(&__end1);
    pcVar6 = std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>::operator->
                       (local_a8);
    if ((pcVar6->NamelinkOnly & 1U) == 0) {
      std::operator+(&local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                     &(this->super_cmExportFileGenerator).Namespace);
      pcVar6 = std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>::operator->
                         (local_a8);
      cmGeneratorTarget::GetExportName_abi_cxx11_(&local_108,pcVar6->Target);
      std::operator+(&local_c8,&local_e8,&local_108);
      std::__cxx11::string::operator+=((string *)(sep.field_2._M_local_buf + 8),(string *)&local_c8)
      ;
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::operator=((string *)&__range1," ");
      pcVar6 = std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>::operator->
                         (local_a8);
      pVar12 = std::
               set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
               ::insert(&(this->super_cmExportFileGenerator).ExportedTargets,&pcVar6->Target);
      local_128 = (_Base_ptr)pVar12.first._M_node;
      local_120 = pVar12.second;
      local_118 = local_128;
      local_110 = local_120;
      if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
        poVar7 = std::operator<<((ostream *)local_2a8,"install(EXPORT \"");
        pcVar5 = cmInstallExportGenerator::GetExportSet(this->IEGen);
        psVar9 = cmExportSet::GetName_abi_cxx11_(pcVar5);
        poVar7 = std::operator<<(poVar7,(string *)psVar9);
        poVar7 = std::operator<<(poVar7,"\" ...) ");
        poVar7 = std::operator<<(poVar7,"includes target \"");
        pcVar6 = std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>::operator->
                           (local_a8);
        psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar6->Target);
        poVar7 = std::operator<<(poVar7,(string *)psVar9);
        std::operator<<(poVar7,"\" more than once in the export set.");
        std::__cxx11::ostringstream::str();
        cmSystemTools::Error((string *)local_2c8);
        std::__cxx11::string::~string((string *)local_2c8);
        this_local._7_1_ = 0;
        bVar1 = true;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a8);
        goto LAB_00a98b95;
      }
      local_130 = std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>::get
                            (local_a8);
      std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::push_back
                ((vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *)
                 ((long)&expectedTargets.field_2 + 8),&local_130);
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_*,_std::vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>_>
    ::operator++(&__end1);
  }
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xc])
            (this,os,(undefined1 *)((long)&sep.field_2 + 8));
  bVar1 = false;
LAB_00a98b95:
  std::__cxx11::string::~string((string *)&__range1);
  std::__cxx11::string::~string((string *)(sep.field_2._M_local_buf + 8));
  if (!bVar1) {
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x18])(this,os);
    local_5e5 = false;
    this_00 = (vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *)
              ((long)&expectedTargets.field_2 + 8);
    __end1_1 = std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::begin(this_00);
    te_1 = (cmTargetExport *)
           std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<cmTargetExport_**,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
                               *)&te_1), bVar1) {
      ppcVar8 = __gnu_cxx::
                __normal_iterator<cmTargetExport_**,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
                ::operator*(&__end1_1);
      targetExport = *ppcVar8;
      target = targetExport->Target;
      TVar2 = GetExportTargetType(this,targetExport);
      local_5e5 = local_5e5 || TVar2 != INTERFACE_LIBRARY;
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[6])
                (this,os,target,(ulong)TVar2);
      this_01 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)((long)&includesDestinationDirs.field_2 + 8);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map(this_01);
      std::__cxx11::string::string((string *)local_350);
      cmExportFileGenerator::PopulateIncludeDirectoriesInterface
                (&this->super_cmExportFileGenerator,target,InstallInterface,this_01,targetExport,
                 (string *)local_350);
      cmExportFileGenerator::PopulateSourcesInterface
                (&this->super_cmExportFileGenerator,target,InstallInterface,
                 (ImportPropertyMap *)((long)&includesDestinationDirs.field_2 + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_370,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",&local_371);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_370,target,InstallInterface,
                 (ImportPropertyMap *)((long)&includesDestinationDirs.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_370);
      std::allocator<char>::~allocator(&local_371);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_398,"INTERFACE_COMPILE_DEFINITIONS",&local_399);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_398,target,InstallInterface,
                 (ImportPropertyMap *)((long)&includesDestinationDirs.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_398);
      std::allocator<char>::~allocator(&local_399);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3c0,"INTERFACE_COMPILE_OPTIONS",&local_3c1);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_3c0,target,InstallInterface,
                 (ImportPropertyMap *)((long)&includesDestinationDirs.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_3c0);
      std::allocator<char>::~allocator(&local_3c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3e8,"INTERFACE_PRECOMPILE_HEADERS",&local_3e9);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_3e8,target,InstallInterface,
                 (ImportPropertyMap *)((long)&includesDestinationDirs.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_3e8);
      std::allocator<char>::~allocator(&local_3e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_410,"INTERFACE_AUTOUIC_OPTIONS",&local_411);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_410,target,InstallInterface,
                 (ImportPropertyMap *)((long)&includesDestinationDirs.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_410);
      std::allocator<char>::~allocator(&local_411);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_438,"INTERFACE_AUTOMOC_MACRO_NAMES",&local_439);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_438,target,InstallInterface,
                 (ImportPropertyMap *)((long)&includesDestinationDirs.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_438);
      std::allocator<char>::~allocator(&local_439);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_460,"INTERFACE_COMPILE_FEATURES",&local_461);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_460,target,InstallInterface,
                 (ImportPropertyMap *)((long)&includesDestinationDirs.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_460);
      std::allocator<char>::~allocator(&local_461);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_488,"INTERFACE_LINK_OPTIONS",
                 (allocator<char> *)(errorMessage.field_2._M_local_buf + 0xf));
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_488,target,InstallInterface,
                 (ImportPropertyMap *)((long)&includesDestinationDirs.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_488);
      std::allocator<char>::~allocator((allocator<char> *)(errorMessage.field_2._M_local_buf + 0xf))
      ;
      cmExportFileGenerator::PopulateLinkDirectoriesInterface
                (&this->super_cmExportFileGenerator,target,InstallInterface,
                 (ImportPropertyMap *)((long)&includesDestinationDirs.field_2 + 8));
      cmExportFileGenerator::PopulateLinkDependsInterface
                (&this->super_cmExportFileGenerator,target,InstallInterface,
                 (ImportPropertyMap *)((long)&includesDestinationDirs.field_2 + 8));
      std::__cxx11::string::string((string *)local_4b0);
      bVar1 = cmExportFileGenerator::PopulateCxxModuleExportProperties
                        (&this->super_cmExportFileGenerator,target,
                         (ImportPropertyMap *)((long)&includesDestinationDirs.field_2 + 8),
                         InstallInterface,(string *)local_350,(string *)local_4b0);
      if (bVar1) {
        bVar1 = cmExportFileGenerator::PopulateExportProperties
                          (&this->super_cmExportFileGenerator,target,
                           (ImportPropertyMap *)((long)&includesDestinationDirs.field_2 + 8),
                           (string *)local_4b0);
        if (bVar1) {
          PVar3 = cmGeneratorTarget::GetPolicyStatusCMP0022(target);
          local_651 = false;
          if (PVar3 != WARN) {
            PVar3 = cmGeneratorTarget::GetPolicyStatusCMP0022(target);
            local_651 = PVar3 != OLD;
          }
          local_4b1 = local_651;
          if (((local_651 != false) &&
              (bVar1 = cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
                                 (&this->super_cmExportFileGenerator,target,InstallInterface,
                                  (ImportPropertyMap *)((long)&includesDestinationDirs.field_2 + 8))
              , bVar1)) && (((this->super_cmExportFileGenerator).ExportOld & 1U) == 0)) {
            cmExportFileGenerator::SetRequiredCMakeVersion
                      (&this->super_cmExportFileGenerator,2,8,0xc);
          }
          if (TVar2 == INTERFACE_LIBRARY) {
            cmExportFileGenerator::SetRequiredCMakeVersion(&this->super_cmExportFileGenerator,3,0,0)
            ;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4e0,"INTERFACE_SOURCES",&local_4e1);
          local_4c0 = cmGeneratorTarget::GetProperty(target,&local_4e0);
          bVar1 = cmValue::operator_cast_to_bool(&local_4c0);
          std::__cxx11::string::~string((string *)&local_4e0);
          std::allocator<char>::~allocator(&local_4e1);
          if (bVar1) {
            cmExportFileGenerator::SetRequiredCMakeVersion(&this->super_cmExportFileGenerator,3,1,0)
            ;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_508,"INTERFACE_POSITION_INDEPENDENT_CODE",
                     (allocator<char> *)(cxx_modules_name.field_2._M_local_buf + 0xf));
          cmExportFileGenerator::PopulateInterfaceProperty
                    (&this->super_cmExportFileGenerator,(string *)local_508,target,
                     (ImportPropertyMap *)((long)&includesDestinationDirs.field_2 + 8));
          std::__cxx11::string::~string((string *)local_508);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(cxx_modules_name.field_2._M_local_buf + 0xf));
          cmExportFileGenerator::PopulateCompatibleInterfaceProperties
                    (&this->super_cmExportFileGenerator,target,
                     (ImportPropertyMap *)((long)&includesDestinationDirs.field_2 + 8));
          (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x10])
                    (this,target,os,(undefined1 *)((long)&includesDestinationDirs.field_2 + 8));
          cmExportFileGenerator::GenerateTargetFileSets
                    (&this->super_cmExportFileGenerator,target,os,targetExport);
          bVar1 = false;
        }
        else {
          cmSystemTools::Error((string *)local_4b0);
          this_local._7_1_ = 0;
          bVar1 = true;
        }
      }
      else {
        cmSystemTools::Error((string *)local_4b0);
        this_local._7_1_ = 0;
        bVar1 = true;
      }
      std::__cxx11::string::~string((string *)local_4b0);
      std::__cxx11::string::~string((string *)local_350);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)((long)&includesDestinationDirs.field_2 + 8));
      if (bVar1) goto LAB_00a999d5;
      __gnu_cxx::
      __normal_iterator<cmTargetExport_**,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
      ::operator++(&__end1_1);
    }
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x19])(this,os);
    cxx_modules_name.field_2._M_local_buf[0xe] = '\x01';
    pcVar5 = cmInstallExportGenerator::GetExportSet(this->IEGen);
    psVar9 = cmExportSet::GetName_abi_cxx11_(pcVar5);
    std::__cxx11::string::string((string *)&__range2,(string *)psVar9);
    cmExportFileGenerator::GenerateCxxModuleInformation
              (&this->super_cmExportFileGenerator,(string *)&__range2,os);
    if (local_5e5) {
      pvVar10 = &(this->super_cmExportFileGenerator).Configurations;
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(pvVar10);
      c = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(pvVar10);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&c), bVar1) {
        pbVar11 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2);
        bVar1 = GenerateImportCxxModuleConfigTargetInclusion(this,(string *)&__range2,pbVar11);
        if (!bVar1) {
          cxx_modules_name.field_2._M_local_buf[0xe] = '\0';
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
    }
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x1a])(this,os);
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[9])(this,os);
    if (local_5e5) {
      pvVar10 = &(this->super_cmExportFileGenerator).Configurations;
      __end2_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(pvVar10);
      c_1 = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(pvVar10);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&c_1), bVar1) {
        pbVar11 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2_1);
        uVar4 = (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x1b])
                          (this,pbVar11);
        if ((uVar4 & 1) == 0) {
          cxx_modules_name.field_2._M_local_buf[0xe] = '\0';
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2_1);
      }
    }
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[10])(this,os);
    this_local._7_1_ = cxx_modules_name.field_2._M_local_buf[0xe] & 1;
    std::__cxx11::string::~string((string *)&__range2);
  }
LAB_00a999d5:
  std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::~vector
            ((vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *)
             ((long)&expectedTargets.field_2 + 8));
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmExportInstallFileGenerator::GenerateMainFile(std::ostream& os)
{
  std::vector<cmTargetExport*> allTargets;
  {
    std::string expectedTargets;
    std::string sep;
    for (std::unique_ptr<cmTargetExport> const& te :
         this->IEGen->GetExportSet()->GetTargetExports()) {
      if (te->NamelinkOnly) {
        continue;
      }
      expectedTargets += sep + this->Namespace + te->Target->GetExportName();
      sep = " ";
      if (this->ExportedTargets.insert(te->Target).second) {
        allTargets.push_back(te.get());
      } else {
        std::ostringstream e;
        e << "install(EXPORT \"" << this->IEGen->GetExportSet()->GetName()
          << "\" ...) "
          << "includes target \"" << te->Target->GetName()
          << "\" more than once in the export set.";
        cmSystemTools::Error(e.str());
        return false;
      }
    }

    this->GenerateExpectedTargetsCode(os, expectedTargets);
  }

  // Compute the relative import prefix for the file
  this->GenerateImportPrefix(os);

  bool requiresConfigFiles = false;
  // Create all the imported targets.
  for (cmTargetExport* te : allTargets) {
    cmGeneratorTarget* gt = te->Target;
    cmStateEnums::TargetType targetType = this->GetExportTargetType(te);

    requiresConfigFiles =
      requiresConfigFiles || targetType != cmStateEnums::INTERFACE_LIBRARY;

    this->GenerateImportTargetCode(os, gt, targetType);

    ImportPropertyMap properties;

    std::string includesDestinationDirs;
    this->PopulateIncludeDirectoriesInterface(
      gt, cmGeneratorExpression::InstallInterface, properties, *te,
      includesDestinationDirs);
    this->PopulateSourcesInterface(gt, cmGeneratorExpression::InstallInterface,
                                   properties);
    this->PopulateInterfaceProperty("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_DEFINITIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_PRECOMPILE_HEADERS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_AUTOUIC_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_AUTOMOC_MACRO_NAMES", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_FEATURES", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_LINK_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateLinkDirectoriesInterface(
      gt, cmGeneratorExpression::InstallInterface, properties);
    this->PopulateLinkDependsInterface(
      gt, cmGeneratorExpression::InstallInterface, properties);

    std::string errorMessage;
    if (!this->PopulateCxxModuleExportProperties(
          gt, properties, cmGeneratorExpression::InstallInterface,
          includesDestinationDirs, errorMessage)) {
      cmSystemTools::Error(errorMessage);
      return false;
    }

    if (!this->PopulateExportProperties(gt, properties, errorMessage)) {
      cmSystemTools::Error(errorMessage);
      return false;
    }

    const bool newCMP0022Behavior =
      gt->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
      gt->GetPolicyStatusCMP0022() != cmPolicies::OLD;
    if (newCMP0022Behavior) {
      if (this->PopulateInterfaceLinkLibrariesProperty(
            gt, cmGeneratorExpression::InstallInterface, properties) &&
          !this->ExportOld) {
        this->SetRequiredCMakeVersion(2, 8, 12);
      }
    }
    if (targetType == cmStateEnums::INTERFACE_LIBRARY) {
      this->SetRequiredCMakeVersion(3, 0, 0);
    }
    if (gt->GetProperty("INTERFACE_SOURCES")) {
      // We can only generate INTERFACE_SOURCES in CMake 3.3, but CMake 3.1
      // can consume them.
      this->SetRequiredCMakeVersion(3, 1, 0);
    }

    this->PopulateInterfaceProperty("INTERFACE_POSITION_INDEPENDENT_CODE", gt,
                                    properties);

    this->PopulateCompatibleInterfaceProperties(gt, properties);

    this->GenerateInterfaceProperties(gt, os, properties);

    this->GenerateTargetFileSets(gt, os, te);
  }

  this->LoadConfigFiles(os);

  bool result = true;

  std::string cxx_modules_name = this->IEGen->GetExportSet()->GetName();
  this->GenerateCxxModuleInformation(cxx_modules_name, os);
  if (requiresConfigFiles) {
    for (std::string const& c : this->Configurations) {
      if (!this->GenerateImportCxxModuleConfigTargetInclusion(cxx_modules_name,
                                                              c)) {
        result = false;
      }
    }
  }

  this->CleanupTemporaryVariables(os);
  this->GenerateImportedFileCheckLoop(os);

  // Generate an import file for each configuration.
  // Don't do this if we only export INTERFACE_LIBRARY targets.
  if (requiresConfigFiles) {
    for (std::string const& c : this->Configurations) {
      if (!this->GenerateImportFileConfig(c)) {
        result = false;
      }
    }
  }

  this->GenerateMissingTargetsCheckCode(os);

  return result;
}